

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::OneofDescriptorProto::SharedDtor(OneofDescriptorProto *this)

{
  string *default_value;
  OneofDescriptorProto *pOVar1;
  OneofDescriptorProto *this_local;
  
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->name_,default_value);
  pOVar1 = internal_default_instance();
  if ((this != pOVar1) && (this->options_ != (OneofOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void OneofDescriptorProto::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete options_;
  }
}